

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvidiamon.cpp
# Opt level: O1

void __thiscall nvidiamon::nvidiamon(nvidiamon *this)

{
  _Rb_tree_header *p_Var1;
  pointer ppVar2;
  pointer pcVar3;
  bool bVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long lVar6;
  pointer ppVar7;
  initializer_list<prmon::parameter> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  undefined1 local_270 [32];
  _Alloc_hider local_250;
  char local_240 [16];
  _Alloc_hider local_230;
  char local_220 [16];
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [192];
  parameter local_f0;
  parameter local_90;
  
  (this->super_MessageBase).logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->super_MessageBase).logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Imonitor)._vptr_Imonitor = (_func_int **)&PTR__nvidiamon_001b5c98;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"ngpus","");
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"1","");
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"1","");
  prmon::parameter::parameter((parameter *)local_1b0,&local_290,&local_2b0,&local_2d0);
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"gpusmpct","");
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"%","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"%","");
  prmon::parameter::parameter((parameter *)(local_1b0 + 0x60),&local_2f0,&local_310,&local_330);
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"gpumempct","");
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"%","");
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"%","");
  prmon::parameter::parameter(&local_f0,&local_350,&local_370,&local_390);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"gpufbmem","");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"kB","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"kB","");
  prmon::parameter::parameter(&local_90,&local_1d0,&local_1f0,&local_210);
  __l._M_len = 4;
  __l._M_array = (iterator)local_1b0;
  std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::vector
            (&this->params,__l,(allocator_type *)&local_3b0);
  lVar6 = -0x180;
  paVar5 = &local_90.m_avg_unit.field_2;
  do {
    if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*(undefined1 **)(paVar5->_M_local_buf + -0x10)) {
      operator_delete(*(undefined1 **)(paVar5->_M_local_buf + -0x10));
    }
    if (paVar5->_M_local_buf + -0x20 != *(char **)(paVar5->_M_local_buf + -0x30)) {
      operator_delete(*(char **)(paVar5->_M_local_buf + -0x30));
    }
    if (paVar5->_M_local_buf + -0x40 != *(char **)(paVar5->_M_local_buf + -0x50)) {
      operator_delete(*(char **)(paVar5->_M_local_buf + -0x50));
    }
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(paVar5->_M_local_buf + -0x60);
    lVar6 = lVar6 + 0x60;
  } while (lVar6 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  p_Var1 = &(this->nvidia_stats)._M_t._M_impl.super__Rb_tree_header;
  (this->nvidia_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nvidia_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nvidia_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nvidia_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->nvidia_stats)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->MB_to_KB = 0x400;
  local_1b0._0_8_ = local_1b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"nvidiamon","");
  MessageBase::log_init(&this->super_MessageBase,(string *)local_1b0,&global_logging_level);
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_);
  }
  ppVar7 = (this->params).super__Vector_base<prmon::parameter,_std::allocator<prmon::parameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->params).super__Vector_base<prmon::parameter,_std::allocator<prmon::parameter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar7 != ppVar2) {
    do {
      local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
      pcVar3 = (ppVar7->m_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3b0,pcVar3,pcVar3 + (ppVar7->m_name)._M_string_length);
      local_270._0_8_ = local_270 + 0x10;
      pcVar3 = (ppVar7->m_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_270,pcVar3,pcVar3 + (ppVar7->m_name)._M_string_length);
      local_250._M_p = local_240;
      pcVar3 = (ppVar7->m_max_unit)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,pcVar3,pcVar3 + (ppVar7->m_max_unit)._M_string_length);
      pcVar3 = (ppVar7->m_avg_unit)._M_dataplus._M_p;
      local_230._M_p = local_220;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,pcVar3,pcVar3 + (ppVar7->m_avg_unit)._M_string_length);
      prmon::monitored_value::monitored_value
                ((monitored_value *)local_1b0,(parameter *)local_270,false,0);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
      ::_M_emplace_unique<std::__cxx11::string_const,prmon::monitored_value>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
                  *)&this->nvidia_stats,&local_3b0,(monitored_value *)local_1b0);
      if ((undefined1 *)local_1b0._64_8_ != local_1b0 + 0x50) {
        operator_delete((void *)local_1b0._64_8_);
      }
      if ((undefined1 *)local_1b0._32_8_ != local_1b0 + 0x30) {
        operator_delete((void *)local_1b0._32_8_);
      }
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_);
      }
      if (local_230._M_p != local_220) {
        operator_delete(local_230._M_p);
      }
      if (local_250._M_p != local_240) {
        operator_delete(local_250._M_p);
      }
      if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
        operator_delete((void *)local_270._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p);
      }
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != ppVar2);
  }
  bVar4 = test_nvidia_smi(this);
  this->valid = bVar4;
  return;
}

Assistant:

nvidiamon::nvidiamon() {
  log_init(MONITOR_NAME);
#undef MONITOR_NAME
  for (const auto& param : params) {
    nvidia_stats.emplace(param.get_name(), prmon::monitored_value(param));
  }

  // Attempt to execute nvidia-smi
  // If this works we are valid, but if not then we can't get data
  valid = test_nvidia_smi();
}